

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

ConstantValue * __thiscall
slang::ast::builtins::SeverityTask::eval
          (ConstantValue *__return_storage_ptr__,SeverityTask *this,EvalContext *context,Args *args,
          SourceRange sourceRange,SystemCallInfo *callInfo)

{
  size_t sVar1;
  Diagnostic *this_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  bool local_38;
  
  local_68._0_8_ = args->_M_ptr;
  local_68._8_8_ = (args->_M_extent)._M_extent_value;
  if ((this->taskKind == Fatal) && (sVar1 = (args->_M_extent)._M_extent_value, sVar1 != 0)) {
    local_68._8_8_ = sVar1 - 1;
    local_68._0_8_ = args->_M_ptr + 1;
  }
  FmtHelpers::formatDisplay_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_58,(FmtHelpers *)(callInfo->scope).ptr,(Scope *)context,
             (EvalContext *)local_68,
             (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             sourceRange.startLoc);
  if (local_38 != false) {
    if ((Symbol *)local_58._8_8_ != (Symbol *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,0,0,
                 ": ",2);
    }
    this_00 = EvalContext::addDiag
                        (context,*(DiagCode *)(&DAT_004b9bb0 + (long)(int)this->taskKind * 4),
                         sourceRange);
    Diagnostic::addStringAllowEmpty(this_00,(string *)local_58);
    if ((this->taskKind & ~Error) == Warning) {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\x04';
      goto LAB_0040c5f4;
    }
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
   + 0x20) = '\0';
LAB_0040c5f4:
  if (local_38 == true) {
    local_38 = false;
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_,(size_t)(local_58._16_8_ + 1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange sourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        auto argCopy = args;
        if (taskKind == ElabSystemTaskKind::Fatal && !args.empty())
            argCopy = args.subspan(1);

        auto str = FmtHelpers::formatDisplay(*callInfo.scope, context, argCopy);
        if (!str)
            return nullptr;

        if (!str->empty())
            str->insert(0, ": ");

        DiagCode code;
        switch (taskKind) {
            case ElabSystemTaskKind::Fatal:
                code = diag::FatalTask;
                break;
            case ElabSystemTaskKind::Error:
                code = diag::ErrorTask;
                break;
            case ElabSystemTaskKind::Warning:
                code = diag::WarningTask;
                break;
            case ElabSystemTaskKind::Info:
                code = diag::InfoTask;
                break;
            default:
                SLANG_UNREACHABLE;
        }

        context.addDiag(code, sourceRange).addStringAllowEmpty(*str);

        // Return something valid here for info / warning; since this is a void-function or,
        // equivalently, a task, nothing will inspect the result, but we only want it to not
        // abort further evaluation for errors / fatals.
        if (taskKind == ElabSystemTaskKind::Info || taskKind == ElabSystemTaskKind::Warning)
            return ConstantValue::NullPlaceholder{};
        return nullptr;
    }